

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmem.c
# Opt level: O3

void * luaM_malloc_(lua_State *L,size_t size,int tag)

{
  global_State *pgVar1;
  void *pvVar2;
  
  if (size == 0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pgVar1 = L->l_G;
    pvVar2 = (*pgVar1->frealloc)(pgVar1->ud,(void *)0x0,(long)tag,size);
    if (pvVar2 == (void *)0x0) {
      pvVar2 = tryagain(L,(void *)0x0,(long)tag,size);
      if (pvVar2 == (void *)0x0) {
        luaD_throw(L,'\x04');
      }
    }
    pgVar1->GCdebt = pgVar1->GCdebt - size;
  }
  return pvVar2;
}

Assistant:

void *luaM_malloc_ (lua_State *L, size_t size, int tag) {
  if (size == 0)
    return NULL;  /* that's all */
  else {
    global_State *g = G(L);
    void *newblock = firsttry(g, NULL, cast_sizet(tag), size);
    if (l_unlikely(newblock == NULL)) {
      newblock = tryagain(L, NULL, cast_sizet(tag), size);
      if (newblock == NULL)
        luaM_error(L);
    }
    g->GCdebt -= cast(l_mem, size);
    return newblock;
  }
}